

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

UBool __thiscall icu_63::FCDUTF8CollationIterator::nextHasLccc(FCDUTF8CollationIterator *this)

{
  uint8_t *puVar1;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  puVar1 = (this->super_UTF8CollationIterator).u8;
  lVar7 = (long)(this->super_UTF8CollationIterator).pos;
  bVar5 = puVar1[lVar7];
  if ((bVar5 < 0xcc) || (bVar5 != 0xea && (byte)(bVar5 + 0x1c) < 10)) {
    return '\0';
  }
  uVar10 = lVar7 + 1;
  uVar6 = (this->super_UTF8CollationIterator).length;
  uVar4 = 0xfffd;
  if ((uint)uVar10 == uVar6) goto LAB_002222a6;
  uVar3 = (uint)bVar5;
  if (bVar5 < 0xe0) {
    uVar3 = uVar3 & 0x1f;
  }
  else {
    if (bVar5 < 0xf0) {
      uVar3 = uVar3 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar3] >> (puVar1[uVar10] >> 5) & 1) == 0) goto LAB_002222a6;
      bVar5 = puVar1[uVar10] & 0x3f;
    }
    else {
      if (0xf4 < bVar5) goto LAB_002222a6;
      if (((((uint)(int)""[puVar1[uVar10] >> 4] >> (uVar3 - 0xf0 & 0x1f) & 1) == 0) ||
          (uVar8 = lVar7 + 2, (uint)uVar8 == uVar6)) || (bVar5 = puVar1[uVar8] + 0x80, 0x3f < bVar5)
         ) goto LAB_002222a6;
      uVar3 = puVar1[uVar10] & 0x3f | (uVar3 - 0xf0) * 0x40;
      uVar10 = uVar8 & 0xffffffff;
    }
    uVar9 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar9;
    if (uVar9 == uVar6) goto LAB_002222a6;
    uVar3 = (uint)bVar5 | uVar3 << 6;
  }
  if ((byte)(puVar1[(int)uVar10] ^ 0x80) < 0x40) {
    uVar4 = uVar3 << 6 | puVar1[(int)uVar10] ^ 0x80;
  }
LAB_002222a6:
  uVar6 = (uVar4 >> 10) + 0xd7c0 & 0xffff;
  if ((int)uVar4 < 0x10000) {
    uVar6 = uVar4;
  }
  UVar2 = CollationFCD::hasLccc(uVar6);
  return UVar2;
}

Assistant:

UBool
FCDUTF8CollationIterator::nextHasLccc() const {
    U_ASSERT(state == CHECK_FWD && pos != length);
    // The lowest code point with ccc!=0 is U+0300 which is CC 80 in UTF-8.
    // CJK U+4000..U+DFFF except U+Axxx are also FCD-inert. (Lead bytes E4..ED except EA.)
    UChar32 c = u8[pos];
    if(c < 0xcc || (0xe4 <= c && c <= 0xed && c != 0xea)) { return FALSE; }
    int32_t i = pos;
    U8_NEXT_OR_FFFD(u8, i, length, c);
    if(c > 0xffff) { c = U16_LEAD(c); }
    return CollationFCD::hasLccc(c);
}